

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.cpp
# Opt level: O0

environment_params_t * __thiscall
so_5::environment_params_t::add_named_dispatcher
          (environment_params_t *this,nonempty_name_t *name,dispatcher_unique_ptr_t *dispatcher)

{
  pointer __p;
  string *__k;
  mapped_type *this_00;
  shared_ptr<so_5::dispatcher_t> local_30;
  dispatcher_unique_ptr_t *local_20;
  dispatcher_unique_ptr_t *dispatcher_local;
  nonempty_name_t *name_local;
  environment_params_t *this_local;
  
  local_20 = dispatcher;
  dispatcher_local = (dispatcher_unique_ptr_t *)name;
  name_local = (nonempty_name_t *)this;
  __p = std::unique_ptr<so_5::dispatcher_t,_std::default_delete<so_5::dispatcher_t>_>::release
                  (dispatcher);
  std::shared_ptr<so_5::dispatcher_t>::shared_ptr<so_5::dispatcher_t,void>(&local_30,__p);
  __k = nonempty_name_t::query_name_abi_cxx11_(name);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>_>_>_>
            ::operator[](&this->m_named_dispatcher_map,__k);
  std::shared_ptr<so_5::dispatcher_t>::operator=(this_00,&local_30);
  std::shared_ptr<so_5::dispatcher_t>::~shared_ptr(&local_30);
  return this;
}

Assistant:

environment_params_t &
environment_params_t::add_named_dispatcher(
	nonempty_name_t name,
	dispatcher_unique_ptr_t dispatcher )
{
	m_named_dispatcher_map[ name.query_name() ] =
		dispatcher_ref_t( dispatcher.release() );
	return *this;
}